

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void statlist(LexState *ls)

{
  uint uVar1;
  
  do {
    uVar1 = (ls->t).token - 0x104;
    if (uVar1 < 0x1e) {
      if ((0x20020007U >> (uVar1 & 0x1f) & 1) != 0) {
        return;
      }
      if (uVar1 == 0xe) {
        statement(ls);
        return;
      }
    }
    statement(ls);
  } while( true );
}

Assistant:

static void statlist(LexState *ls) {
    /* statlist -> { stat [';'] } */
    while (!block_follow(ls, 1)) {
        if (ls->t.token == TK_RETURN) {
            statement(ls);
            return;  /* 'return' must be last statement */
        }
        statement(ls);
    }
}